

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_tec_int(REF_EDGE ref_edge,char *filename,REF_INT *data)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  FILE *__s;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  pRVar1 = ref_edge->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x244,
           "ref_edge_tec_int","unable to open file");
    RVar3 = 2;
  }
  else {
    fwrite("title=\"tecplot refine scalar file\"\n",0x23,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"s\"\n",0x1c,1,__s);
    fprintf(__s,"zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)(ref_edge->n * 2),(ulong)(uint)ref_edge->n,"point","felineseg");
    if (0 < ref_edge->n) {
      lVar6 = 0;
      do {
        lVar4 = (long)ref_edge->e2n[lVar6 * 2];
        pRVar2 = pRVar1->real;
        fprintf(__s," %.16e %.16e %.16e %d\n",pRVar2[lVar4 * 0xf],pRVar2[lVar4 * 0xf + 1],
                pRVar2[lVar4 * 0xf + 2],(ulong)(uint)data[lVar6]);
        lVar4 = (long)ref_edge->e2n[lVar6 * 2 + 1];
        pRVar2 = pRVar1->real;
        fprintf(__s," %.16e %.16e %.16e %d\n",pRVar2[lVar4 * 0xf],pRVar2[lVar4 * 0xf + 1],
                pRVar2[lVar4 * 0xf + 2],(ulong)(uint)data[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < ref_edge->n);
    }
    if (0 < ref_edge->n) {
      uVar7 = 1;
      iVar5 = 0;
      do {
        fprintf(__s," %d %d\n",(ulong)uVar7,(ulong)(uVar7 + 1));
        iVar5 = iVar5 + 1;
        uVar7 = uVar7 + 2;
      } while (iVar5 < ref_edge->n);
    }
    fclose(__s);
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_int(REF_EDGE ref_edge, const char *filename,
                                    REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT edge;
  REF_INT node;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"s\"\n");

  fprintf(
      file,
      "zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      2 * ref_edge_n(ref_edge), ref_edge_n(ref_edge), "point", "felineseg");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            data[edge]);
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            data[edge]);
  }

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++)
    fprintf(file, " %d %d\n", 1 + 2 * edge, 2 + 2 * edge);

  fclose(file);

  return REF_SUCCESS;
}